

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

TapBranchDataStruct * __thiscall
cfd::js::api::json::TapBranchData::ConvertToStruct
          (TapBranchDataStruct *__return_storage_ptr__,TapBranchData *this)

{
  TapBranchDataStruct::TapBranchDataStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->branch_hash);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->tree_string);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

TapBranchDataStruct TapBranchData::ConvertToStruct() const {  // NOLINT
  TapBranchDataStruct result;
  result.tapscript = tapscript_;
  result.branch_hash = branch_hash_;
  result.tree_string = tree_string_;
  result.ignore_items = ignore_items;
  return result;
}